

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

double __thiscall
duckdb::Interpolator<false>::Interpolate<unsigned_long,double,duckdb::QuantileIndirect<int>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<int> *accessor)

{
  uint uVar1;
  CURSOR *pCVar2;
  bool bVar3;
  reference pvVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [12];
  double result_1;
  double local_60;
  string local_58;
  double local_38;
  
  pCVar2 = accessor->data;
  uVar5 = (pCVar2->scan).current_row_index;
  bVar3 = (pCVar2->scan).next_row_index <= lidx;
  if (lidx == hidx) {
    if (lidx < uVar5 || bVar3) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar2->inputs,(ColumnDataScanState *)lidx,(DataChunk *)&pCVar2->scan);
      pvVar4 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      pCVar2->data = *(int **)(pvVar4 + 0x20);
      pvVar4 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      FlatVector::VerifyFlatVector(pvVar4);
      pCVar2->validity = (ValidityMask *)(pvVar4 + 0x28);
      uVar5 = (pCVar2->scan).current_row_index;
    }
    uVar1 = pCVar2->data[(uint)((int)lidx - (int)uVar5)];
    bVar3 = duckdb::TryCast::Operation<int,double>(uVar1,&local_60,false);
    if (!bVar3) {
      auVar7 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,double>(&local_58,(duckdb *)(ulong)uVar1,auVar7._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar7._0_8_,(string *)&local_58);
      __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (lidx < uVar5 || bVar3) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar2->inputs,(ColumnDataScanState *)lidx,(DataChunk *)&pCVar2->scan);
      pvVar4 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      pCVar2->data = *(int **)(pvVar4 + 0x20);
      pvVar4 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      FlatVector::VerifyFlatVector(pvVar4);
      pCVar2->validity = (ValidityMask *)(pvVar4 + 0x28);
      uVar5 = (pCVar2->scan).current_row_index;
    }
    uVar1 = pCVar2->data[(uint)((int)lidx - (int)uVar5)];
    bVar3 = duckdb::TryCast::Operation<int,double>(uVar1,&local_60,false);
    if (!bVar3) {
      auVar7 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,double>(&local_58,(duckdb *)(ulong)uVar1,auVar7._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar7._0_8_,(string *)&local_58);
      __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_38 = local_60;
    pCVar2 = accessor->data;
    uVar5 = (pCVar2->scan).current_row_index;
    if ((pCVar2->scan).next_row_index <= hidx || hidx < uVar5) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar2->inputs,(ColumnDataScanState *)hidx,(DataChunk *)&pCVar2->scan);
      pvVar4 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      pCVar2->data = *(int **)(pvVar4 + 0x20);
      pvVar4 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      FlatVector::VerifyFlatVector(pvVar4);
      pCVar2->validity = (ValidityMask *)(pvVar4 + 0x28);
      uVar5 = (pCVar2->scan).current_row_index;
    }
    uVar1 = pCVar2->data[(uint)((int)hidx - (int)uVar5)];
    bVar3 = duckdb::TryCast::Operation<int,double>(uVar1,&local_60,false);
    if (!bVar3) {
      auVar7 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,double>(&local_58,(duckdb *)(ulong)uVar1,auVar7._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar7._0_8_,(string *)&local_58);
      __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar6 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_60 = dVar6 * local_60 + local_38 * (1.0 - dVar6);
  }
  return local_60;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}